

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossfactorstobin.cpp
# Opt level: O2

void lossfactorstobin::DoIt(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  int counter;
  event_amplification ea;
  float factor;
  amplification_factor af;
  vector<amplification_factor,_std::allocator<amplification_factor>_> factors;
  char line [4096];
  
  WriteOpts();
  factors.super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  factors.super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  factors.super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fgets(line,0x1000,_stdin);
  uVar3 = 2;
  counter = 0;
  iVar4 = 0;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      WriteCounterAmplitudesAndFactors(counter,&factors);
      std::_Vector_base<amplification_factor,_std::allocator<amplification_factor>_>::~_Vector_base
                (&factors.
                  super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>);
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%d,%d,%f",&ea,&ea.amplification_id,&factor);
    if (iVar1 != 3) break;
    if (ea.event_id != iVar4) {
      if (iVar4 != 0) {
        WriteCounterAmplitudesAndFactors(counter,&factors);
      }
      fwrite(&ea,4,1,_stdout);
      counter = 0;
      iVar4 = ea.event_id;
      if (factors.super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          factors.super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        factors.super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             factors.super__Vector_base<amplification_factor,_std::allocator<amplification_factor>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    af.amplification_id = ea.amplification_id;
    af.factor = factor;
    std::vector<amplification_factor,_std::allocator<amplification_factor>_>::push_back
              (&factors,&af);
    counter = counter + 1;
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s\n",(ulong)uVar3,line);
  exit(1);
}

Assistant:

void DoIt() {

    WriteOpts();

    int current_event_id = 0;
    int counter = 0;
    event_amplification ea;
    amplification_factor af;
    std::vector<amplification_factor> factors;
    float factor;
    char line[4096];

    fgets(line, sizeof(line), stdin);   // Skip header row
    int lineno = 2;

    while (fgets(line, sizeof(line), stdin) != 0) {

      if (sscanf(line, "%d,%d,%f", &ea.event_id, &ea.amplification_id,
		 &factor) != 3) {
	fprintf(stderr, "FATAL: Invalid data in line %d:\n%s\n", lineno, line);
	exit(EXIT_FAILURE);
      }

      if (ea.event_id != current_event_id) {
	if (current_event_id != 0) {
	  WriteCounterAmplitudesAndFactors(counter, factors);
	}
	fwrite(&ea.event_id, sizeof(ea.event_id), 1, stdout);
	current_event_id = ea.event_id;
	counter = 0;
	factors.clear();
      }

      af.amplification_id = ea.amplification_id;
      af.factor = factor;
      factors.push_back(af);
      ++counter;
      ++lineno;

    }

    WriteCounterAmplitudesAndFactors(counter, factors);

  }